

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  string command;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  fasttext::utils::initTables();
  if (argc < 2) {
    printUsage();
    goto LAB_0010d2e1;
  }
  std::__cxx11::string::string((string *)local_38,argv[1],&local_39);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
LAB_0010d2af:
    train(argc,argv);
    fasttext::utils::freeTables();
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    return 0;
  }
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) goto LAB_0010d2af;
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) goto LAB_0010d2af;
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
    test(argc,argv);
  }
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
    printVectors(argc,argv);
  }
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
LAB_0010d353:
    predict(argc,argv);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_38);
    if (iVar1 == 0) goto LAB_0010d353;
  }
  printUsage();
LAB_0010d2e1:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  utils::initTables();
  if (argc < 2) {
    printUsage();
    exit(EXIT_FAILURE);
  }
  std::string command(argv[1]);
  if (command == "skipgram" || command == "cbow" || command == "supervised") {
    train(argc, argv);
  } else if (command == "test") {
    test(argc, argv);
  } else if (command == "print-vectors") {
    printVectors(argc, argv);
  } else if (command == "predict" || command == "predict-prob" ) {
    predict(argc, argv);
  } else {
    printUsage();
    exit(EXIT_FAILURE);
  }
  utils::freeTables();
  return 0;
}